

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdtr.c
# Opt level: O3

double hcephes_bdtrc(int k,int n,double p)

{
  double dVar1;
  double dVar2;
  
  if ((0.0 <= p) && (p <= 1.0)) {
    if (k < 0) {
      return 1.0;
    }
    if (k <= n) {
      if (n - k == 0) {
        return 0.0;
      }
      dVar2 = (double)(n - k);
      if (k == 0) {
        if (p < 0.01) {
          dVar1 = hcephes_log1p(-p);
          dVar2 = hcephes_expm1(dVar1 * dVar2);
          return -dVar2;
        }
        dVar2 = pow(1.0 - p,dVar2);
        return 1.0 - dVar2;
      }
      dVar2 = hcephes_incbet((double)(k + 1),dVar2,p);
      return dVar2;
    }
  }
  hcephes_mtherr("bdtrc",1);
  return 0.0;
}

Assistant:

HCEPHES_API double hcephes_bdtrc(int k, int n, double p) {
    double dk, dn;

    if ((p < 0.0) || (p > 1.0))
        goto domerr;
    if (k < 0)
        return (1.0);

    if (n < k) {
    domerr:
        hcephes_mtherr("bdtrc", HCEPHES_DOMAIN);
        return (0.0);
    }

    if (k == n)
        return (0.0);
    dn = n - k;
    if (k == 0) {
        if (p < .01)
            dk = -hcephes_expm1(dn * hcephes_log1p(-p));
        else
            dk = 1.0 - pow(1.0 - p, dn);
    } else {
        dk = k + 1;
        dk = hcephes_incbet(dk, dn, p);
    }
    return (dk);
}